

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
          *heapBucket)

{
  BucketData<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *pBVar1;
  size_t sVar2;
  size_t sVar3;
  BucketData<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_> *bucketData;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
  *heapBucket_local;
  RecyclerSweep *this_local;
  
  if ((heapBucket->super_HeapBucket).heapInfo == this->heapInfo) {
    pBVar1 = GetBucketData<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                       (this,heapBucket);
    sVar2 = HeapBlockList::
            Count<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                      (pBVar1->pendingSweepList);
    sVar3 = HeapBlockList::
            Count<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                      (pBVar1->pendingEmptyBlockList);
    this_local = (RecyclerSweep *)(sVar2 + sVar3);
  }
  else {
    this_local = (RecyclerSweep *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}